

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilteringRegister.hpp
# Opt level: O0

shared_ptr<supermap::Filter<supermap::Key<1UL>_>_> __thiscall
supermap::
FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>::
getRegisteredItemsInfo
          (FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>
           *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<supermap::Filter<supermap::Key<1UL>_>_> *in_RSI;
  shared_ptr<supermap::Filter<supermap::Key<1UL>_>_> *in_RDI;
  shared_ptr<supermap::Filter<supermap::Key<1UL>_>_> sVar1;
  
  std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>::shared_ptr(in_RSI,in_RDI);
  sVar1.super___shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)in_RDI;
  return (shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>)
         sVar1.super___shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<FilterBase> getRegisteredItemsInfo() const noexcept override {
        return filter_;
    }